

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

void share_xchannel_confirmation
               (ssh_sharing_connstate *cs,share_xchannel *xc,share_channel *chan,
               uint downstream_window)

{
  uint uVar1;
  share_xchannel_message *ptr;
  ConnectionLayer *pCVar2;
  uint8_t *p;
  strbuf *buf_o;
  int pktlen;
  share_xchannel_message *msg;
  
  while (ptr = xc->msghead, ptr != (share_xchannel_message *)0x0) {
    xc->msghead = ptr->next;
    pktlen = ptr->datalen;
    if (3 < pktlen) {
      uVar1 = chan->downstream_id;
      *(uint *)ptr->data =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      pktlen = ptr->datalen;
    }
    send_packet_to_downstream(cs,ptr->type,ptr->data,pktlen,chan);
    safefree(ptr);
  }
  buf_o = strbuf_new();
  BinarySink_put_uint32(buf_o->binarysink_,(ulong)xc->server_id);
  BinarySink_put_uint32(buf_o->binarysink_,(ulong)(downstream_window - xc->window));
  pCVar2 = cs->parent->cl;
  (*pCVar2->vt->send_packet_from_downstream)
            (pCVar2,cs->id,0x5d,buf_o->s,(int)buf_o->len,
             "window adjustment after downstream accepted X channel");
  strbuf_free(buf_o);
  return;
}

Assistant:

void share_xchannel_confirmation(struct ssh_sharing_connstate *cs,
                                 struct share_xchannel *xc,
                                 struct share_channel *chan,
                                 unsigned downstream_window)
{
    strbuf *packet;

    /*
     * Send all the queued messages downstream.
     */
    while (xc->msghead) {
        struct share_xchannel_message *msg = xc->msghead;
        xc->msghead = msg->next;

        if (msg->datalen >= 4)
            PUT_32BIT_MSB_FIRST(msg->data, chan->downstream_id);
        send_packet_to_downstream(cs, msg->type,
                                  msg->data, msg->datalen, chan);

        sfree(msg);
    }

    /*
     * Send a WINDOW_ADJUST back upstream, to synchronise the window
     * size downstream thinks it's presented with the one we've
     * actually presented.
     */
    packet = strbuf_new();
    put_uint32(packet, xc->server_id);
    put_uint32(packet, downstream_window - xc->window);
    ssh_send_packet_from_downstream(
        cs->parent->cl, cs->id, SSH2_MSG_CHANNEL_WINDOW_ADJUST,
        packet->s, packet->len,
        "window adjustment after downstream accepted X channel");
    strbuf_free(packet);
}